

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::update_listen_interfaces(session_impl *this)

{
  pointer *in;
  bool bVar1;
  string *psVar2;
  reference args;
  undefined8 uVar3;
  size_type sVar4;
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  *in_00;
  string local_e0;
  socket_type_t local_bd;
  error_code_enum local_bc;
  operation_t local_b5;
  int local_b4;
  address local_b0;
  reference local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  local_60;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  err;
  string net_interfaces;
  session_impl *this_local;
  
  psVar2 = session_settings::get_str_abi_cxx11_(&this->m_settings,5);
  in = &err.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ::std::__cxx11::string::string((string *)in,(string *)psVar2);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  parse_listen_interfaces
            (&local_60,(string *)in,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48);
  ::std::
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ::operator=(&this->m_listen_interfaces,
              (vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
               *)&local_60);
  ::std::
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ::~vector((vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
             *)&local_60);
  __end2 = ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
  e = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&e), bVar1) {
    args = __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
    local_90 = args;
    boost::asio::ip::address::address(&local_b0);
    local_b4 = 0;
    local_b5 = parse_address;
    local_bc = invalid_port;
    local_bd = tcp;
    alert_manager::
    emplace_alert<libtorrent::listen_failed_alert,std::__cxx11::string_const&,boost::asio::ip::address,int,libtorrent::operation_t,libtorrent::errors::error_code_enum,libtorrent::socket_type_t>
              (&this->m_alerts,args,&local_b0,&local_b4,&local_b5,&local_bc,&local_bd);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  bVar1 = should_log(this);
  if (bVar1) {
    uVar3 = ::std::__cxx11::string::c_str();
    session_log(this,"update listen interfaces: %s",uVar3);
    sVar4 = ::std::
            vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
            ::size(&this->m_listen_interfaces);
    print_listen_interfaces_abi_cxx11_(&local_e0,(aux *)&this->m_listen_interfaces,in_00);
    uVar3 = ::std::__cxx11::string::c_str();
    session_log(this,"parsed listen interfaces count: %d, ifaces: %s",sVar4 & 0xffffffff,uVar3);
    ::std::__cxx11::string::~string((string *)&local_e0);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  ::std::__cxx11::string::~string
            ((string *)
             &err.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void session_impl::update_listen_interfaces()
	{
		INVARIANT_CHECK;

		std::string const net_interfaces = m_settings.get_str(settings_pack::listen_interfaces);
		std::vector<std::string> err;
		m_listen_interfaces = parse_listen_interfaces(net_interfaces, err);

		for (auto const& e : err)
		{
			m_alerts.emplace_alert<listen_failed_alert>(e, lt::address{}, 0
				, operation_t::parse_address, errors::invalid_port, lt::socket_type_t::tcp);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			session_log("update listen interfaces: %s", net_interfaces.c_str());
			session_log("parsed listen interfaces count: %d, ifaces: %s"
				, int(m_listen_interfaces.size())
				, print_listen_interfaces(m_listen_interfaces).c_str());
		}
#endif
	}